

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::FeaturesTest_Edition2023InferredFeatures_Test::TestBody
          (FeaturesTest_Edition2023InferredFeatures_Test *this)

{
  Descriptor *pDVar1;
  FileDescriptor *pFVar2;
  MessageLite *pMVar3;
  Nonnull<const_char_*> pcVar4;
  char *pcVar5;
  Metadata MVar6;
  FileDescriptorProto file_proto;
  internal local_180 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  LogMessageFatal local_170;
  CppFeatures_StringType local_15c;
  undefined1 local_158 [80];
  FileDescriptorProto local_108;
  
  local_158._0_8_ =
       (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x2d3;
  local_158._8_8_ =
       "\n    name: \"foo.proto\"\n    syntax: \"editions\"\n    edition: EDITION_2023\n    message_type {\n      name: \"Foo\"\n      field { name: \"str\" number: 1 label: LABEL_OPTIONAL type: TYPE_STRING }\n      field {\n        name: \"cord\"\n        number: 2\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { ctype: CORD }\n      }\n      field {\n        name: \"piece\"\n        number: 3\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options { ctype: STRING_PIECE }\n      }\n      field {\n        name: \"view\"\n        number: 4\n        label: LABEL_OPTIONAL\n        type: TYPE_STRING\n        options {\n          features {\n            [pb.cpp] { string_type: VIEW }\n          }\n        }\n      }\n    }\n  "
  ;
  ParseTextOrDie::operator_cast_to_FileDescriptorProto(&local_108,(ParseTextOrDie *)local_158);
  MVar6 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar6.descriptor)->file_);
  MVar6 = pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
  ValidationErrorTest::BuildFileInTestPool((ValidationErrorTest *)this,(MVar6.descriptor)->file_);
  pFVar2 = DescriptorPool::BuildFile
                     (&(this->super_FeaturesTest).super_FeaturesBaseTest.pool_,&local_108);
  if (pFVar2 == (FileDescriptor *)0x0) {
    absl::lts_20250127::log_internal::DieBecauseNull
              ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x21af,"pool_.BuildFile(file_proto)");
  }
  if (0 < (long)pFVar2->message_type_count_) {
    pDVar1 = pFVar2->message_types_;
    if ((long)pDVar1->field_count_ < 1) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,(long)pDVar1->field_count_,"index < field_count()");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_170,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xa88,pcVar4);
    }
    else {
      GetCoreFeatures<google::protobuf::FieldDescriptor>((FeatureSet *)local_158,pDVar1->fields_);
      pMVar3 = protobuf::internal::ExtensionSet::GetMessage
                         ((ExtensionSet *)(local_158 + 0x10),pb::cpp,
                          (MessageLite *)PTR__CppFeatures_default_instance__0198a1d0);
      local_15c = (CppFeatures_StringType)pMVar3[1]._internal_metadata_.ptr_;
      testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
                (local_180,"GetCoreFeatures(message->field(0)).GetExtension(pb::cpp).string_type()",
                 "pb::CppFeatures::STRING",&local_15c,&pb::CppFeatures::STRING);
      FeatureSet::~FeatureSet((FeatureSet *)local_158);
      if (local_180[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_158);
        if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar5 = (local_178->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_170,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x21b4,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_170,(Message *)local_158);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
        if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
             )local_158._0_8_ !=
            (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          (**(code **)(*(_func_int **)local_158._0_8_ + 8))();
        }
      }
      if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_178,local_178);
      }
      if ((long)pDVar1->field_count_ < 2) {
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (1,(long)pDVar1->field_count_,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_170,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar4);
      }
      else {
        GetCoreFeatures<google::protobuf::FieldDescriptor>
                  ((FeatureSet *)local_158,pDVar1->fields_ + 1);
        pMVar3 = protobuf::internal::ExtensionSet::GetMessage
                           ((ExtensionSet *)(local_158 + 0x10),pb::cpp,
                            (MessageLite *)PTR__CppFeatures_default_instance__0198a1d0);
        local_15c = (CppFeatures_StringType)pMVar3[1]._internal_metadata_.ptr_;
        testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
                  (local_180,
                   "GetCoreFeatures(message->field(1)).GetExtension(pb::cpp).string_type()",
                   "pb::CppFeatures::CORD",&local_15c,&pb::CppFeatures::CORD);
        FeatureSet::~FeatureSet((FeatureSet *)local_158);
        if (local_180[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_158);
          if (local_178 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar5 = (local_178->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x21b7,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_170,(Message *)local_158);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
          if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_158._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(_func_int **)local_158._0_8_ + 8))();
          }
        }
        if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_178,local_178);
        }
        if (3 < (long)pDVar1->field_count_) {
          GetCoreFeatures<google::protobuf::FieldDescriptor>
                    ((FeatureSet *)local_158,pDVar1->fields_ + 3);
          pMVar3 = protobuf::internal::ExtensionSet::GetMessage
                             ((ExtensionSet *)(local_158 + 0x10),pb::cpp,
                              (MessageLite *)PTR__CppFeatures_default_instance__0198a1d0);
          local_15c = (CppFeatures_StringType)pMVar3[1]._internal_metadata_.ptr_;
          testing::internal::CmpHelperEQ<pb::CppFeatures_StringType,pb::CppFeatures_StringType>
                    (local_180,
                     "GetCoreFeatures(message->field(3)).GetExtension(pb::cpp).string_type()",
                     "pb::CppFeatures::VIEW",&local_15c,&pb::CppFeatures::VIEW);
          FeatureSet::~FeatureSet((FeatureSet *)local_158);
          if (local_180[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_158);
            if (local_178 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = anon_var_dwarf_a22956 + 5;
            }
            else {
              pcVar5 = (local_178->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_170,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x21ba,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_170,(Message *)local_158);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_170);
            if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                 )local_158._0_8_ !=
                (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              (**(code **)(*(_func_int **)local_158._0_8_ + 8))();
            }
          }
          if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_178,local_178);
          }
          FileDescriptorProto::~FileDescriptorProto(&local_108);
          return;
        }
        pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (3,(long)pDVar1->field_count_,"index < field_count()");
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_170,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa88,pcVar4);
      }
    }
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_170);
  }
  pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     (0,(long)pFVar2->message_type_count_,"index < message_type_count()");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_158,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xae7,pcVar4);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_158);
}

Assistant:

TEST_F(FeaturesTest, Edition2023InferredFeatures) {
  FileDescriptorProto file_proto = ParseTextOrDie(R"pb(
    name: "foo.proto"
    syntax: "editions"
    edition: EDITION_2023
    message_type {
      name: "Foo"
      field { name: "str" number: 1 label: LABEL_OPTIONAL type: TYPE_STRING }
      field {
        name: "cord"
        number: 2
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: CORD }
      }
      field {
        name: "piece"
        number: 3
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options { ctype: STRING_PIECE }
      }
      field {
        name: "view"
        number: 4
        label: LABEL_OPTIONAL
        type: TYPE_STRING
        options {
          features {
            [pb.cpp] { string_type: VIEW }
          }
        }
      }
    }
  )pb");

  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::CppFeatures::GetDescriptor()->file());
  const FileDescriptor* file = ABSL_DIE_IF_NULL(pool_.BuildFile(file_proto));
  const Descriptor* message = file->message_type(0);

  EXPECT_EQ(
      GetCoreFeatures(message->field(0)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::STRING);
  EXPECT_EQ(
      GetCoreFeatures(message->field(1)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::CORD);
  EXPECT_EQ(
      GetCoreFeatures(message->field(3)).GetExtension(pb::cpp).string_type(),
      pb::CppFeatures::VIEW);
}